

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits_tests.cpp
# Opt level: O2

VersionBitsTester * __thiscall
VersionBitsTester::TestState(VersionBitsTester *this,ThresholdState exp,ThresholdState exp_delayed)

{
  int *fmt;
  pointer ppCVar1;
  ThresholdState state;
  ThresholdState state_00;
  ThresholdState state_01;
  ThresholdState state_02;
  CBlockIndex *pindexPrev;
  uint64_t uVar2;
  int bits;
  iterator in_R8;
  iterator pvVar3;
  ThresholdState *in_R9;
  ThresholdState *pTVar4;
  iterator pvVar5;
  long lVar6;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  char *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  string *in_stack_fffffffffffffdc0;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  assertion_result local_160;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  int height;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  lazy_ostream local_e0;
  undefined1 *local_d0;
  string *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  ThresholdState exp_delayed_local;
  ThresholdState exp_local;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  exp_delayed_local = exp_delayed;
  exp_local = exp;
  if (exp != exp_delayed) {
    local_b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
    ;
    local_a8 = "";
    local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = (iterator)in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x9a;
    file.m_begin = (iterator)&local_b0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_c0,msg);
    local_e0.m_empty = false;
    local_e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
    local_d0 = boost::unit_test::lazy_ostream::inst;
    local_c8 = (string *)0xc694e1;
    local_f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
    ;
    local_e8 = "";
    in_stack_fffffffffffffdc0 = &local_58;
    local_58._M_dataplus._M_p._0_4_ = 3;
    pvVar3 = (iterator)0x2;
    pTVar4 = &exp_local;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ThresholdState,ThresholdState>
              (&local_e0,&local_f0,0x9a,1,2,pTVar4,"exp",in_stack_fffffffffffffdc0,
               "ThresholdState::ACTIVE");
    local_100 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
    ;
    local_f8 = "";
    local_110 = &boost::unit_test::basic_cstring<char_const>::null;
    local_108 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = (iterator)pTVar4;
    msg_00.m_begin = pvVar3;
    file_00.m_end = (iterator)0x9b;
    file_00.m_begin = (iterator)&local_100;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_110,
               msg_00);
    local_e0.m_empty = false;
    local_e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
    local_d0 = boost::unit_test::lazy_ostream::inst;
    local_c8 = (string *)0xc694e1;
    local_120 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
    ;
    local_118 = "";
    local_58._M_dataplus._M_p._0_4_ = 2;
    in_stack_fffffffffffffdb8 = "exp_delayed";
    in_R9 = &exp_delayed_local;
    in_R8 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ThresholdState,ThresholdState>
              (&local_e0,&local_120,0x9b,1);
  }
  ppCVar1 = (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
      super__Vector_impl_data._M_start == ppCVar1) {
    pindexPrev = (CBlockIndex *)0x0;
  }
  else {
    pindexPrev = ppCVar1[-1];
  }
  fmt = &this->num;
  bits = 0;
  for (lVar6 = 0x170; lVar6 != 0x2c0; lVar6 = lVar6 + 0x38) {
    uVar2 = RandomMixin<FastRandomContext>::randbits
                      (&this->m_rng->super_RandomMixin<FastRandomContext>,bits);
    if (uVar2 == 0) {
      state = TestConditionChecker::GetStateFor
                        ((TestConditionChecker *)((long)this + lVar6 + -0x150),pindexPrev);
      state_00 = TestConditionChecker::GetStateFor
                           ((TestConditionChecker *)((long)this->checker + lVar6 + -0x20),pindexPrev
                           );
      state_01 = TestConditionChecker::GetStateFor
                           ((TestConditionChecker *)((long)this->checker_delayed + lVar6 + -0x20),
                            pindexPrev);
      state_02 = TestConditionChecker::GetStateFor
                           ((TestConditionChecker *)((long)this->checker_always + lVar6 + -0x20),
                            pindexPrev);
      if (pindexPrev == (CBlockIndex *)0x0) {
        height = 0;
      }
      else {
        height = pindexPrev->nHeight + 1;
      }
      local_138 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_130 = "";
      local_148 = &boost::unit_test::basic_cstring<char_const>::null;
      local_140 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_01.m_end = (iterator)in_R9;
      msg_01.m_begin = in_R8;
      file_01.m_end = (iterator)0xa8;
      file_01.m_begin = (iterator)&local_138;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_148,
                 msg_01);
      local_160.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(state == exp_local);
      local_160.m_message.px = (element_type *)0x0;
      local_160.m_message.pn.pi_ = (sp_counted_base *)0x0;
      StateName_abi_cxx11_(&local_78,exp_local);
      StateName_abi_cxx11_(&local_98,state);
      tinyformat::format<int,std::__cxx11::string,int,std::__cxx11::string>
                (&local_58,(tinyformat *)"Test %i for %s height %d (got %s)",(char *)fmt,
                 (int *)&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&height,
                 (int *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdb8);
      local_e0.m_empty = false;
      local_e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139e30;
      local_d0 = boost::unit_test::lazy_ostream::inst;
      local_170 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_168 = "";
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pvVar3 = &DAT_00000001;
      pvVar5 = &DAT_00000001;
      local_c8 = &local_58;
      boost::test_tools::tt_detail::report_assertion
                (&local_160,&local_e0,1,1,WARN,(check_type)in_stack_fffffffffffffdc0,
                 (size_t)&local_170,0xa8);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_78);
      boost::detail::shared_count::~shared_count(&local_160.m_message.pn);
      local_180 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_178 = "";
      local_190 = &boost::unit_test::basic_cstring<char_const>::null;
      local_188 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_02.m_end = pvVar5;
      msg_02.m_begin = pvVar3;
      file_02.m_end = (iterator)0xa9;
      file_02.m_begin = (iterator)&local_180;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_190,
                 msg_02);
      local_160.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(state_00 == exp_delayed_local);
      local_160.m_message.px = (element_type *)0x0;
      local_160.m_message.pn.pi_ = (sp_counted_base *)0x0;
      StateName_abi_cxx11_(&local_78,exp_delayed_local);
      StateName_abi_cxx11_(&local_98,state_00);
      tinyformat::format<int,std::__cxx11::string,int,std::__cxx11::string>
                (&local_58,(tinyformat *)"Test %i for %s height %d (got %s; delayed case)",
                 (char *)fmt,(int *)&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&height,
                 (int *)&local_98,pbVar7);
      local_e0.m_empty = false;
      local_e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139e30;
      local_d0 = boost::unit_test::lazy_ostream::inst;
      local_1a0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_198 = "";
      pvVar3 = &DAT_00000001;
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
      local_c8 = &local_58;
      boost::test_tools::tt_detail::report_assertion
                (&local_160,&local_e0,1,1,WARN,(check_type)in_stack_fffffffffffffdc0,
                 (size_t)&local_1a0,0xa9);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_78);
      boost::detail::shared_count::~shared_count(&local_160.m_message.pn);
      local_1b0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_1a8 = "";
      local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_03.m_end = (iterator)pbVar7;
      msg_03.m_begin = pvVar3;
      file_03.m_end = (iterator)0xaa;
      file_03.m_begin = (iterator)&local_1b0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1c0,
                 msg_03);
      local_98._M_dataplus._M_p._0_1_ = state_01 == ACTIVE;
      local_98._M_string_length = 0;
      local_98.field_2._M_allocated_capacity = 0;
      StateName_abi_cxx11_(&local_78,state_01);
      tinyformat::format<int,int,std::__cxx11::string>
                (&local_58,(tinyformat *)"Test %i for ACTIVE height %d (got %s; always active case)"
                 ,(char *)fmt,&height,(int *)&local_78,pbVar7);
      local_e0.m_empty = false;
      local_e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139e30;
      local_d0 = boost::unit_test::lazy_ostream::inst;
      local_1d0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_1c8 = "";
      pvVar3 = &DAT_00000001;
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
      local_c8 = &local_58;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_98,&local_e0,1,1,WARN,
                 (check_type)in_stack_fffffffffffffdc0,(size_t)&local_1d0,0xaa);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&local_98.field_2._M_allocated_capacity);
      local_1e0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_1d8 = "";
      local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_04.m_end = (iterator)pbVar7;
      msg_04.m_begin = pvVar3;
      file_04.m_end = (iterator)0xab;
      file_04.m_begin = (iterator)&local_1e0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1f0,
                 msg_04);
      local_98._M_dataplus._M_p._0_1_ = state_02 == FAILED;
      local_98._M_string_length = 0;
      local_98.field_2._M_allocated_capacity = 0;
      StateName_abi_cxx11_(&local_78,state_02);
      tinyformat::format<int,int,std::__cxx11::string>
                (&local_58,(tinyformat *)"Test %i for FAILED height %d (got %s; never active case)",
                 (char *)fmt,&height,(int *)&local_78,pbVar7);
      local_e0.m_empty = false;
      local_e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139e30;
      local_d0 = boost::unit_test::lazy_ostream::inst;
      local_200 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_1f8 = "";
      in_stack_fffffffffffffdb8 = (char *)0x0;
      in_R8 = &DAT_00000001;
      in_R9 = (ThresholdState *)&DAT_00000001;
      local_c8 = &local_58;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_98,&local_e0,1,1,WARN,
                 (check_type)in_stack_fffffffffffffdc0,(size_t)&local_200,0xab);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&local_98.field_2._M_allocated_capacity);
    }
    bits = bits + 1;
  }
  this->num = this->num + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

VersionBitsTester& TestState(ThresholdState exp, ThresholdState exp_delayed)
    {
        if (exp != exp_delayed) {
            // only expected differences are that delayed stays in locked_in longer
            BOOST_CHECK_EQUAL(exp, ThresholdState::ACTIVE);
            BOOST_CHECK_EQUAL(exp_delayed, ThresholdState::LOCKED_IN);
        }

        const CBlockIndex* pindex = Tip();
        for (int i = 0; i < CHECKERS; i++) {
            if (m_rng.randbits(i) == 0) {
                ThresholdState got = checker[i].GetStateFor(pindex);
                ThresholdState got_delayed = checker_delayed[i].GetStateFor(pindex);
                ThresholdState got_always = checker_always[i].GetStateFor(pindex);
                ThresholdState got_never = checker_never[i].GetStateFor(pindex);
                // nHeight of the next block. If vpblock is empty, the next (ie first)
                // block should be the genesis block with nHeight == 0.
                int height = pindex == nullptr ? 0 : pindex->nHeight + 1;
                BOOST_CHECK_MESSAGE(got == exp, strprintf("Test %i for %s height %d (got %s)", num, StateName(exp), height, StateName(got)));
                BOOST_CHECK_MESSAGE(got_delayed == exp_delayed, strprintf("Test %i for %s height %d (got %s; delayed case)", num, StateName(exp_delayed), height, StateName(got_delayed)));
                BOOST_CHECK_MESSAGE(got_always == ThresholdState::ACTIVE, strprintf("Test %i for ACTIVE height %d (got %s; always active case)", num, height, StateName(got_always)));
                BOOST_CHECK_MESSAGE(got_never == ThresholdState::FAILED, strprintf("Test %i for FAILED height %d (got %s; never active case)", num, height, StateName(got_never)));
            }
        }
        num++;
        return *this;
    }